

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall DLoadSaveMenu::ExtractSaveData(DLoadSaveMenu *this,int index)

{
  FSaveGameNode *pFVar1;
  ulong uVar2;
  FFont *font;
  bool bVar3;
  uint uVar4;
  int iVar5;
  FSaveGameNode **ppFVar6;
  char *pcVar7;
  FILE *__stream;
  PNGHandle *png_00;
  char *__s;
  char *str;
  FBrokenLines *pFVar8;
  FTexture *pFVar9;
  size_t local_60;
  size_t timelen;
  size_t totallen;
  size_t commentlen;
  char *comment;
  char *pcomment;
  char *time;
  FSaveGameNode *node;
  PNGHandle *png;
  FILE *file;
  int index_local;
  DLoadSaveMenu *this_local;
  
  UnloadSaveData(this);
  uVar4 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::Size(&SaveGames);
  if ((uint)index < uVar4) {
    ppFVar6 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&SaveGames,(long)index);
    pFVar1 = *ppFVar6;
    if (((pFVar1 != (FSaveGameNode *)0x0) && (bVar3 = FString::IsEmpty(&pFVar1->Filename), !bVar3))
       && ((pFVar1->bOldVersion & 1U) == 0)) {
      pcVar7 = FString::GetChars(&pFVar1->Filename);
      __stream = fopen(pcVar7,"rb");
      if (__stream != (FILE *)0x0) {
        png_00 = M_VerifyPNG((FILE *)__stream);
        if (png_00 != (PNGHandle *)0x0) {
          pcVar7 = M_GetPNGText(png_00,"Creation Time");
          __s = M_GetPNGText(png_00,"Comment");
          if (__s == (char *)0x0) {
            totallen = 0;
          }
          else {
            totallen = strlen(__s);
          }
          if (pcVar7 == (char *)0x0) {
            local_60 = 0;
            timelen = totallen + 1;
          }
          else {
            local_60 = strlen(pcVar7);
            timelen = local_60 + totallen + 3;
          }
          if (timelen != 0) {
            str = (char *)operator_new__(timelen);
            if (local_60 != 0) {
              memcpy(str,pcVar7,local_60);
              str[local_60] = '\n';
              str[local_60 + 1] = '\n';
              local_60 = local_60 + 2;
            }
            if (totallen != 0) {
              memcpy(str + local_60,__s,totallen);
            }
            str[local_60 + totallen] = '\0';
            font = SmallFont;
            iVar5 = DCanvas::GetWidth((DCanvas *)screen);
            uVar2 = (long)(iVar5 * 0xd8) / 0x280;
            pFVar8 = V_BreakLines(font,(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                                   uVar2 & 0xffffffff) / (long)CleanXfac),str,false)
            ;
            this->SaveComment = pFVar8;
            if (str != (char *)0x0) {
              operator_delete__(str);
            }
            if (pcVar7 != (char *)0x0) {
              operator_delete__(pcVar7);
            }
            if (__s != (char *)0x0) {
              operator_delete__(__s);
            }
          }
          pFVar9 = PNGTexture_CreateFromFile(png_00,&pFVar1->Filename);
          this->SavePic = pFVar9;
          if (png_00 != (PNGHandle *)0x0) {
            PNGHandle::~PNGHandle(png_00);
            operator_delete(png_00,0x38);
          }
          iVar5 = FTexture::GetWidth(this->SavePic);
          if ((iVar5 == 1) && (iVar5 = FTexture::GetHeight(this->SavePic), iVar5 == 1)) {
            if (this->SavePic != (FTexture *)0x0) {
              (*this->SavePic->_vptr_FTexture[1])();
            }
            this->SavePic = (FTexture *)0x0;
          }
        }
        fclose(__stream);
      }
    }
  }
  return;
}

Assistant:

void DLoadSaveMenu::ExtractSaveData (int index)
{
	FILE *file;
	PNGHandle *png;
	FSaveGameNode *node;

	UnloadSaveData ();

	if ((unsigned)index < SaveGames.Size() &&
		(node = SaveGames[index]) &&
		!node->Filename.IsEmpty() &&
		!node->bOldVersion &&
		(file = fopen (node->Filename.GetChars(), "rb")) != NULL)
	{
		if (NULL != (png = M_VerifyPNG (file)))
		{
			char *time, *pcomment, *comment;
			size_t commentlen, totallen, timelen;

			// Extract comment
			time = M_GetPNGText (png, "Creation Time");
			pcomment = M_GetPNGText (png, "Comment");
			if (pcomment != NULL)
			{
				commentlen = strlen (pcomment);
			}
			else
			{
				commentlen = 0;
			}
			if (time != NULL)
			{
				timelen = strlen (time);
				totallen = timelen + commentlen + 3;
			}
			else
			{
				timelen = 0;
				totallen = commentlen + 1;
			}
			if (totallen != 0)
			{
				comment = new char[totallen];

				if (timelen)
				{
					memcpy (comment, time, timelen);
					comment[timelen] = '\n';
					comment[timelen+1] = '\n';
					timelen += 2;
				}
				if (commentlen)
				{
					memcpy (comment + timelen, pcomment, commentlen);
				}
				comment[timelen+commentlen] = 0;
				SaveComment = V_BreakLines (SmallFont, 216*screen->GetWidth()/640/CleanXfac, comment);
				delete[] comment;
				delete[] time;
				delete[] pcomment;
			}

			// Extract pic
			SavePic = PNGTexture_CreateFromFile(png, node->Filename);
			delete png;
			if (SavePic->GetWidth() == 1 && SavePic->GetHeight() == 1)
			{
				delete SavePic;
				SavePic = NULL;
			}
		}
		fclose (file);
	}
}